

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O2

bool __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::get_peers
          (dht_default_storage *this,sha1_hash *info_hash,bool noseed,bool scrape,address *requester
          ,entry *peers)

{
  _Rb_tree_header *p_Var1;
  anon_enum_32 aVar2;
  _Base_ptr p_Var3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  _Base_ptr *pp_Var10;
  entry *peVar11;
  list_type *this_00;
  string_type *psVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  _Base_ptr p_Var16;
  peer_entry *this_01;
  aux *this_02;
  aux *paVar17;
  char *pcVar18;
  ulong uVar19;
  peer_entry *p;
  long lVar20;
  aux *paVar21;
  ulong uVar22;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  address local_2c8;
  string_type local_2a8;
  string local_288;
  string local_268;
  sha1_hash iphash;
  peer_entry requester_entry;
  bloom_filter<256> seeds;
  
  p_Var1 = &(this->m_map)._M_t._M_impl.super__Rb_tree_header;
  pp_Var10 = &(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var16 = &p_Var1->_M_header;
  while (p_Var3 = *pp_Var10, p_Var3 != (_Base_ptr)0x0) {
    bVar7 = digest32<160L>::operator<((digest32<160L> *)(p_Var3 + 1),info_hash);
    if (!bVar7) {
      p_Var16 = p_Var3;
    }
    pp_Var10 = &p_Var3->_M_left + bVar7;
  }
  if ((_Rb_tree_header *)p_Var16 != p_Var1) {
    p_Var3 = p_Var16 + 1;
    bVar7 = digest32<160L>::operator<(info_hash,(digest32<160L> *)p_Var3);
    if (!bVar7) {
      lVar13 = 0x50;
      if (requester->type_ == ipv4) {
        lVar13 = 0x38;
      }
      if (*(long *)(p_Var16 + 2) != 0) {
        ::std::__cxx11::string::string((string *)&local_2a8,(string *)&p_Var16[1]._M_right);
        key._M_str = "n";
        key._M_len = 1;
        peVar11 = entry::operator[](peers,key);
        entry::operator=(peVar11,&local_2a8);
        ::std::__cxx11::string::~string((string *)&local_2a8);
      }
      if (scrape) {
        memset(&requester_entry,0,0x100);
        memset((peer_entry *)&seeds,0,0x100);
        lVar4 = *(long *)((long)&p_Var16[1]._M_parent + lVar13);
        for (lVar20 = *(long *)((long)((array<unsigned_int,_5UL> *)&p_Var3->_M_color)->_M_elems +
                               lVar13); lVar20 != lVar4; lVar20 = lVar20 + 0x28) {
          bVar7 = *(short *)(lVar20 + 8) != 2;
          if (bVar7) {
            local_2c8.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)(lVar20 + 0x10);
            local_2c8.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)(lVar20 + 0x18);
            local_2c8.ipv6_address_.scope_id_ = (unsigned_long)*(uint *)(lVar20 + 0x20);
            local_2c8.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
          }
          else {
            local_2c8.ipv4_address_.addr_.s_addr = *(in4_addr_type *)(lVar20 + 0xc);
            local_2c8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
            local_2c8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
            local_2c8.ipv6_address_.scope_id_ = 0;
          }
          local_2c8.type_ = (anon_enum_32)bVar7;
          aux::hash_address(&iphash,&local_2c8);
          this_01 = &requester_entry;
          if (*(char *)(lVar20 + 0x24) != '\0') {
            this_01 = (peer_entry *)&seeds;
          }
          aux::bloom_filter<256>::set((bloom_filter<256> *)this_01,&iphash);
        }
        aux::bloom_filter<256>::to_string_abi_cxx11_
                  (&local_268,(bloom_filter<256> *)&requester_entry);
        key_01._M_str = "BFpe";
        key_01._M_len = 4;
        peVar11 = entry::operator[](peers,key_01);
        entry::operator=(peVar11,&local_268);
        ::std::__cxx11::string::~string((string *)&local_268);
        aux::bloom_filter<256>::to_string_abi_cxx11_(&local_288,&seeds);
        key_02._M_str = "BFsd";
        key_02._M_len = 4;
        peVar11 = entry::operator[](peers,key_02);
        entry::operator=(peVar11,&local_288);
        ::std::__cxx11::string::~string((string *)&local_288);
      }
      else {
        aVar2 = requester->type_;
        uVar9 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4089);
        lVar20 = *(long *)((long)((array<unsigned_int,_5UL> *)&p_Var3->_M_color)->_M_elems + lVar13)
        ;
        lVar4 = *(long *)((long)&p_Var16[1]._M_parent + lVar13);
        key_00._M_str = "values";
        key_00._M_len = 6;
        peVar11 = entry::operator[](peers,key_00);
        this_00 = entry::list(peVar11);
        this_02 = (aux *)0x0;
        lVar5 = *(long *)((long)((array<unsigned_int,_5UL> *)&p_Var3->_M_color)->_M_elems + lVar13);
        for (lVar14 = lVar5; lVar14 != *(long *)((long)&p_Var16[1]._M_parent + lVar13);
            lVar14 = lVar14 + 0x28) {
          uVar15 = *(byte *)(lVar14 + 0x24) ^ 1;
          if (!noseed) {
            uVar15 = 1;
          }
          this_02 = (aux *)(ulong)((int)this_02 + uVar15);
        }
        uVar15 = (int)uVar9 / 4;
        if (aVar2 == ipv4) {
          uVar15 = uVar9;
        }
        if (lVar20 == lVar4) {
          uVar15 = uVar9;
        }
        paVar17 = (aux *)(ulong)uVar15;
        if ((int)this_02 <= (int)uVar15) {
          paVar17 = this_02;
        }
        pcVar18 = (char *)(lVar5 + 0x24);
        while (uVar9 = (uint)paVar17, 0 < (int)uVar9) {
          if ((!noseed) || (*pcVar18 == '\0')) {
            paVar21 = (aux *)(ulong)((int)this_02 - 1);
            lVar20 = aux::random(this_02);
            this_02 = paVar21;
            if ((uint)lVar20 <= uVar9) {
              ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::emplace_back<>
                        (this_00);
              psVar12 = entry::string_abi_cxx11_
                                  ((this_00->
                                   super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + -1);
              ::std::__cxx11::string::resize((ulong)psVar12);
              requester_entry.added.__d.__r = (duration)(psVar12->_M_dataplus)._M_p;
              aux::
              write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&>
                        ((basic_endpoint<boost::asio::ip::tcp> *)(pcVar18 + -0x1c),
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&requester_entry);
              ::std::__cxx11::string::resize((ulong)psVar12);
              paVar17 = (aux *)(ulong)(uVar9 - 1);
            }
          }
          pcVar18 = pcVar18 + 0x28;
        }
      }
      lVar20 = *(long *)((long)&p_Var16[1]._M_parent + lVar13) -
               *(long *)((long)((array<unsigned_int,_5UL> *)&p_Var3->_M_color)->_M_elems + lVar13);
      iVar8 = (*this->m_settings->_vptr_settings_interface[5])
                        (this->m_settings,0x408e,lVar20 % 0x28);
      if ((int)(lVar20 / 0x28) < iVar8) {
        return false;
      }
      requester_entry.added.__d.__r = (duration)0;
      requester_entry.addr.impl_.data_.v6.sin6_scope_id = 0;
      requester_entry.addr.impl_.data_._8_1_ = '\0';
      requester_entry.addr.impl_.data_._9_1_ = '\0';
      requester_entry.addr.impl_.data_._10_1_ = '\0';
      requester_entry.addr.impl_.data_._11_1_ = '\0';
      requester_entry.addr.impl_.data_._12_1_ = '\0';
      requester_entry.addr.impl_.data_._13_1_ = '\0';
      requester_entry.addr.impl_.data_._14_1_ = '\0';
      requester_entry.addr.impl_.data_._15_1_ = '\0';
      requester_entry.addr.impl_.data_._16_8_ = 0;
      requester_entry.addr.impl_.data_._0_8_ = 2;
      requester_entry.seed = false;
      boost::asio::ip::detail::endpoint::address(&requester_entry.addr.impl_,requester);
      lVar20 = *(long *)((long)((array<unsigned_int,_5UL> *)&p_Var3->_M_color)->_M_elems + lVar13);
      uVar22 = (*(long *)((long)&p_Var16[1]._M_parent + lVar13) - lVar20) / 0x28;
      while (uVar19 = uVar22, 0 < (long)uVar19) {
        uVar22 = uVar19 >> 1;
        bVar7 = anon_unknown_0::operator<((peer_entry *)(lVar20 + uVar22 * 0x28),&requester_entry);
        if (bVar7) {
          lVar20 = lVar20 + uVar22 * 0x28 + 0x28;
          uVar22 = ~uVar22 + uVar19;
        }
      }
      if (lVar20 != *(long *)((long)&p_Var16[1]._M_parent + lVar13)) {
        bVar7 = *(short *)(lVar20 + 8) != 2;
        if (bVar7) {
          seeds.bits._8_8_ = *(undefined8 *)(lVar20 + 0x10);
          seeds.bits._16_8_ = *(undefined8 *)(lVar20 + 0x18);
          seeds.bits._24_8_ = ZEXT48(*(uint *)(lVar20 + 0x20));
          seeds.bits[4] = '\0';
          seeds.bits[5] = '\0';
          seeds.bits[6] = '\0';
          seeds.bits[7] = '\0';
        }
        else {
          seeds.bits._4_4_ = *(undefined4 *)(lVar20 + 0xc);
          seeds.bits[8] = '\0';
          seeds.bits[9] = '\0';
          seeds.bits[10] = '\0';
          seeds.bits[0xb] = '\0';
          seeds.bits[0xc] = '\0';
          seeds.bits[0xd] = '\0';
          seeds.bits[0xe] = '\0';
          seeds.bits[0xf] = '\0';
          seeds.bits[0x10] = '\0';
          seeds.bits[0x11] = '\0';
          seeds.bits[0x12] = '\0';
          seeds.bits[0x13] = '\0';
          seeds.bits[0x14] = '\0';
          seeds.bits[0x15] = '\0';
          seeds.bits[0x16] = '\0';
          seeds.bits[0x17] = '\0';
          seeds.bits[0x18] = '\0';
          seeds.bits[0x19] = '\0';
          seeds.bits[0x1a] = '\0';
          seeds.bits[0x1b] = '\0';
          seeds.bits[0x1c] = '\0';
          seeds.bits[0x1d] = '\0';
          seeds.bits[0x1e] = '\0';
          seeds.bits[0x1f] = '\0';
        }
        seeds.bits._0_4_ = ZEXT14(bVar7);
        bVar7 = boost::asio::ip::operator!=((address *)&seeds,requester);
        return bVar7;
      }
      return true;
    }
  }
  sVar6 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  iVar8 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x408c);
  return iVar8 <= (int)sVar6;
}

Assistant:

bool get_peers(sha1_hash const& info_hash
			, bool const noseed, bool const scrape, address const& requester
			, entry& peers) const override
		{
			auto const i = m_map.find(info_hash);
			if (i == m_map.end()) return int(m_map.size()) >= m_settings.get_int(settings_pack::dht_max_torrents);

			torrent_entry const& v = i->second;
			auto const& peersv = requester.is_v4() ? v.peers4 : v.peers6;

			if (!v.name.empty()) peers["n"] = v.name;

			if (scrape)
			{
				aux::bloom_filter<256> downloaders;
				aux::bloom_filter<256> seeds;

				for (auto const& p : peersv)
				{
					sha1_hash const iphash = aux::hash_address(p.addr.address());
					if (p.seed) seeds.set(iphash);
					else downloaders.set(iphash);
				}

				peers["BFpe"] = downloaders.to_string();
				peers["BFsd"] = seeds.to_string();
			}
			else
			{
				tcp const protocol = requester.is_v4() ? tcp::v4() : tcp::v6();
				int to_pick = m_settings.get_int(settings_pack::dht_max_peers_reply);
				TORRENT_ASSERT(to_pick >= 0);
				// if these are IPv6 peers their addresses are 4x the size of IPv4
				// so reduce the max peers 4 fold to compensate
				// max_peers_reply should probably be specified in bytes
				if (!peersv.empty() && protocol == tcp::v6())
					to_pick /= 4;
				entry::list_type& pe = peers["values"].list();

				int candidates = int(std::count_if(peersv.begin(), peersv.end()
					, [=](peer_entry const& e) { return !(noseed && e.seed); }));

				to_pick = std::min(to_pick, candidates);

				for (auto iter = peersv.begin(); to_pick > 0; ++iter)
				{
					// if the node asking for peers is a seed, skip seeds from the
					// peer list
					if (noseed && iter->seed) continue;

					TORRENT_ASSERT(candidates >= to_pick);

					// pick this peer with probability
					// <peers left to pick> / <peers left in the set>
					if (aux::random(std::uint32_t(candidates--)) > std::uint32_t(to_pick))
						continue;

					pe.emplace_back();
					std::string& str = pe.back().string();

					str.resize(18);
					std::string::iterator out = str.begin();
					aux::write_endpoint(iter->addr, out);
					str.resize(std::size_t(out - str.begin()));

					--to_pick;
				}
			}

			if (int(peersv.size()) < m_settings.get_int(settings_pack::dht_max_peers))
				return false;

			// we're at the max peers stored for this torrent
			// only send a write token if the requester is already in the set
			// only check for a match on IP because the peer may be announcing
			// a different port than the one it is using to send DHT messages
			peer_entry requester_entry;
			requester_entry.addr.address(requester);
			auto requester_iter = std::lower_bound(peersv.begin(), peersv.end(), requester_entry);
			return requester_iter == peersv.end()
				|| requester_iter->addr.address() != requester;
		}